

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_ProjectionProfile(ProjectionProfileForm2 ProjectionProfile)

{
  anon_class_8_1_a8c68091 __pred;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  int iVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  code *in_RDI;
  uint32_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  bool horizontal;
  Image image;
  uint8_t intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef8;
  uint8_t in_stack_ffffffffffffff06;
  uint8_t in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  byte bVar2;
  uint32_t in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t uVar3;
  uint32_t in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint8_t value_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  byte local_6d;
  ImageTemplate<unsigned_char> local_38;
  uint8_t local_9;
  code *local_8;
  
  value_00 = (uint8_t)((uint)in_stack_ffffffffffffff2c >> 0x18);
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(in_stack_ffffffffffffff13,
                               CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff07,in_stack_ffffffffffffff06
            );
  Test_Helper::uniformImage
            (value_00,in_stack_ffffffffffffff28,uVar3,
             (Image *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de845);
  iVar1 = Test_Helper::randomValue<int>(0x1de84f);
  local_6d = iVar1 == 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1de875);
  (*local_8)(&local_38,local_6d & 1,&local_88);
  if ((local_6d & 1) == 0) {
    PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  }
  else {
    PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  }
  __first._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_88);
  if ((local_6d & 1) == 0) {
    in_stack_ffffffffffffff14 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    uVar3 = in_stack_ffffffffffffff14;
  }
  else {
    in_stack_ffffffffffffff1c = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    uVar3 = in_stack_ffffffffffffff1c;
  }
  bVar2 = false;
  if (__first._M_current == (uint *)(ulong)uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_fffffffffffffef8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_fffffffffffffef8);
    __last._M_current._4_4_ = in_stack_ffffffffffffff1c;
    __last._M_current._0_4_ = uVar3;
    __pred.value._2_1_ = in_stack_ffffffffffffff12;
    __pred.value._0_2_ = in_stack_ffffffffffffff10;
    __pred.value._3_1_ = bVar2;
    __pred.value._4_4_ = in_stack_ffffffffffffff14;
    in_stack_ffffffffffffff12 =
         std::
         all_of<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Function_Template::form2_ProjectionProfile(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,bool,std::vector<unsigned_int,std::allocator<unsigned_int>>&))::__0>
                   (__first,__last,__pred);
    bVar2 = in_stack_ffffffffffffff12;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)))
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1de9d4);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form2_ProjectionProfile(ProjectionProfileForm2 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, horizontal, projection );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }